

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::handleError(TcpConnection *this)

{
  sz_sock sockfd;
  pointer this_00;
  LogStream *pLVar1;
  self *psVar2;
  char *str;
  SourceFile file;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  int local_14;
  TcpConnection *pTStack_10;
  int err;
  TcpConnection *this_local;
  
  pTStack_10 = this;
  this_00 = std::unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>::
            operator->(&this->m_socket);
  sockfd = Socket::fd(this_00);
  local_14 = sockets::sz_sock_geterror(sockfd);
  Logger::SourceFile::SourceFile<104>
            ((SourceFile *)local_ff8,
             (char (*) [104])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_ff8._0_8_;
  file.m_size = local_ff8._8_4_;
  Logger::Logger(&local_fe8,file,0x1aa,ERROR);
  pLVar1 = Logger::stream(&local_fe8);
  psVar2 = LogStream::operator<<(pLVar1,"TcpConnection::handleError [");
  psVar2 = LogStream::operator<<(psVar2,&this->m_name);
  psVar2 = LogStream::operator<<(psVar2,"] - SO_ERROR = ");
  pLVar1 = LogStream::operator<<(psVar2,local_14);
  psVar2 = LogStream::operator<<(pLVar1," ");
  str = sz_strerror_tl(local_14);
  LogStream::operator<<(psVar2,str);
  Logger::~Logger(&local_fe8);
  return;
}

Assistant:

void TcpConnection::handleError()
{
	int err = sockets::sz_sock_geterror(m_socket->fd());
	LOG_ERROR << "TcpConnection::handleError [" << m_name
		<< "] - SO_ERROR = " << err << " " << sz_strerror_tl(err);
}